

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

void __thiscall
QNetworkAccessBackend::proxyAuthenticationRequired
          (QNetworkAccessBackend *this,QNetworkProxy *proxy,QAuthenticator *authenticator)

{
  long lVar1;
  QNetworkAccessBackendPrivate *authenticator_00;
  undefined8 in_RDX;
  QNetworkProxy *in_RSI;
  QUrl *in_RDI;
  long in_FS_OFFSET;
  QNetworkAccessBackendPrivate *d;
  QNetworkProxy *lastProxyAuthentication;
  undefined1 synchronous;
  QNetworkProxy in_stack_fffffffffffffff0;
  
  synchronous = (undefined1)((ulong)in_RDX >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  authenticator_00 = d_func((QNetworkAccessBackend *)0x1892e4);
  lastProxyAuthentication = (QNetworkProxy *)&stack0xfffffffffffffff0;
  QUrl::QUrl((QUrl *)lastProxyAuthentication);
  isSynchronous((QNetworkAccessBackend *)0x18931d);
  QNetworkAccessManagerPrivate::proxyAuthenticationRequired
            ((QNetworkAccessManagerPrivate *)in_stack_fffffffffffffff0.d.d.ptr,in_RDI,in_RSI,
             (bool)synchronous,(QAuthenticator *)authenticator_00,lastProxyAuthentication);
  QUrl::~QUrl((QUrl *)lastProxyAuthentication);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessBackend::proxyAuthenticationRequired(const QNetworkProxy &proxy,
                                                        QAuthenticator *authenticator)
{
    Q_D(QNetworkAccessBackend);
    Q_ASSERT(authenticator);
    d->m_manager->proxyAuthenticationRequired(QUrl(), proxy, isSynchronous(), authenticator,
                                              &d->m_reply->lastProxyAuthentication);
}